

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int pmain(lua_State *L)

{
  uint uVar1;
  int iVar2;
  lua_Integer lVar3;
  int local_38;
  int optlim;
  int args;
  int script;
  char **argv;
  lua_State *plStack_18;
  int argc;
  lua_State *L_local;
  
  plStack_18 = L;
  lVar3 = lua_tointegerx(L,1,(int *)0x0);
  argv._4_4_ = (int)lVar3;
  _args = (char **)lua_touserdata(plStack_18,2);
  uVar1 = collectargs(_args,&optlim);
  if (optlim < 1) {
    local_38 = argv._4_4_;
  }
  else {
    local_38 = optlim;
  }
  luaL_checkversion_(plStack_18,504.0,0x88);
  if (uVar1 == 1) {
    print_usage(_args[optlim]);
    L_local._4_4_ = 0;
  }
  else {
    if ((uVar1 & 4) != 0) {
      print_version();
    }
    if ((uVar1 & 0x10) != 0) {
      lua_pushboolean(plStack_18,1);
      lua_setfield(plStack_18,-0xf4628,"LUA_NOENV");
    }
    luaL_openlibs(plStack_18);
    createargtable(plStack_18,_args,argv._4_4_,optlim);
    lua_gc(plStack_18,1);
    lua_gc(plStack_18,10,0);
    if (((uVar1 & 0x10) == 0) && (iVar2 = handle_luainit(plStack_18), iVar2 != 0)) {
      L_local._4_4_ = 0;
    }
    else {
      iVar2 = runargs(plStack_18,_args,local_38);
      if (iVar2 == 0) {
        L_local._4_4_ = 0;
      }
      else if ((optlim < 1) || (iVar2 = handle_script(plStack_18,_args + optlim), iVar2 == 0)) {
        if ((uVar1 & 2) == 0) {
          if ((optlim < 1) && ((uVar1 & 0xc) == 0)) {
            print_version();
            doREPL(plStack_18);
          }
        }
        else {
          doREPL(plStack_18);
        }
        lua_pushboolean(plStack_18,1);
        L_local._4_4_ = 1;
      }
      else {
        L_local._4_4_ = 0;
      }
    }
  }
  return L_local._4_4_;
}

Assistant:

static int pmain (lua_State *L) {
  int argc = (int)lua_tointeger(L, 1);
  char **argv = (char **)lua_touserdata(L, 2);
  int script;
  int args = collectargs(argv, &script);
  int optlim = (script > 0) ? script : argc; /* first argv not an option */
  luaL_checkversion(L);  /* check that interpreter has correct version */
  if (args == has_error) {  /* bad arg? */
    print_usage(argv[script]);  /* 'script' has index of bad arg. */
    return 0;
  }
  if (args & has_v)  /* option '-v'? */
    print_version();
  if (args & has_E) {  /* option '-E'? */
    lua_pushboolean(L, 1);  /* signal for libraries to ignore env. vars. */
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }
  luaL_openlibs(L);  /* open standard libraries */
  createargtable(L, argv, argc, script);  /* create table 'arg' */
  lua_gc(L, LUA_GCRESTART);  /* start GC... */
  lua_gc(L, LUA_GCGEN, 0, 0);  /* ...in generational mode */
  if (!(args & has_E)) {  /* no option '-E'? */
    if (handle_luainit(L) != LUA_OK)  /* run LUA_INIT */
      return 0;  /* error running LUA_INIT */
  }
  if (!runargs(L, argv, optlim))  /* execute arguments -e and -l */
    return 0;  /* something failed */
  if (script > 0) {  /* execute main script (if there is one) */
    if (handle_script(L, argv + script) != LUA_OK)
      return 0;  /* interrupt in case of error */
  }
  if (args & has_i)  /* -i option? */
    doREPL(L);  /* do read-eval-print loop */
  else if (script < 1 && !(args & (has_e | has_v))) { /* no active option? */
    if (lua_stdin_is_tty()) {  /* running in interactive mode? */
      print_version();
      doREPL(L);  /* do read-eval-print loop */
    }
    else dofile(L, NULL);  /* executes stdin as a file */
  }
  lua_pushboolean(L, 1);  /* signal no errors */
  return 1;
}